

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::CommittedShaderResources::
DvpVerifyCacheRevisions(CommittedShaderResources *this)

{
  ShaderResourceCacheGL *pSVar1;
  uint uVar2;
  char (*in_R8) [219];
  Uint32 Idx;
  string msg;
  uint local_54;
  string local_50;
  
  uVar2 = (uint)this->ActiveSRBMask;
  if (this->ActiveSRBMask != 0) {
    do {
      local_54 = 0;
      if (uVar2 != 0) {
        for (; (uVar2 >> local_54 & 1) == 0; local_54 = local_54 + 1) {
        }
      }
      pSVar1 = (this->ResourceCaches)._M_elems[local_54];
      if ((pSVar1 != (ShaderResourceCacheGL *)0x0) &&
         ((this->CacheRevisions)._M_elems[local_54] !=
          (pSVar1->super_ShaderResourceCacheBase).m_DvpRevision.super___atomic_base<unsigned_int>.
          _M_i)) {
        FormatString<char[48],unsigned_int,char[219]>
                  (&local_50,(Diligent *)"Revision of the shader resource cache at index ",
                   (char (*) [48])&local_54,
                   (uint *)
                   " does not match the revision recorded when the SRB was committed. This indicates that resources have been changed since that time, but the SRB has not been committed with CommitShaderResources(). This usage is invalid."
                   ,in_R8);
        DebugAssertionFailed
                  (local_50._M_dataplus._M_p,"DvpVerifyCacheRevisions",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x1be);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      uVar2 = uVar2 - 1 & uVar2;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void DvpVerifyCacheRevisions() const
        {
            for (Uint32 ActiveSRBs = ActiveSRBMask; ActiveSRBs != 0;)
            {
                const Uint32                       SRBBit = ExtractLSB(ActiveSRBs);
                const Uint32                       Idx    = PlatformMisc::GetLSB(SRBBit);
                const ShaderResourceCacheImplType* pCache = ResourceCaches[Idx];
                if (pCache != nullptr)
                {
                    DEV_CHECK_ERR(CacheRevisions[Idx] == pCache->DvpGetRevision(),
                                  "Revision of the shader resource cache at index ", Idx,
                                  " does not match the revision recorded when the SRB was committed. "
                                  "This indicates that resources have been changed since that time, but "
                                  "the SRB has not been committed with CommitShaderResources(). This usage is invalid.");
                }
                else
                {
                    // This error will be handled by DvpValidateCommittedShaderResources.
                }
            }
        }